

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_pkm_image(rf_image *__return_storage_ptr__,void *src,rf_int src_size,rf_allocator allocator)

{
  rf_int rVar1;
  rf_image local_80;
  undefined8 local_68;
  long local_60;
  undefined4 local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  void *local_38;
  void *dst;
  rf_int rStack_28;
  int dst_size;
  rf_int src_size_local;
  void *src_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  src_local = allocator.user_data;
  rStack_28 = src_size;
  src_size_local = (rf_int)src;
  memset(__return_storage_ptr__,0,0x18);
  if ((src_size_local != 0) && (0 < rStack_28)) {
    rVar1 = rf_get_pkm_image_size((void *)src_size_local,rStack_28);
    dst._4_4_ = (int)rVar1;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_48 = "rf_load_pkm_image";
    local_40 = 0x45db;
    local_68 = 0;
    local_60 = (long)dst._4_4_;
    local_58 = 0;
    local_38 = (void *)(*(code *)allocator_local.user_data)(&src_local,1);
    rf_load_pkm_image_to_buffer(&local_80,(void *)src_size_local,rStack_28,local_38,(long)dst._4_4_)
    ;
    __return_storage_ptr__->data = local_80.data;
    __return_storage_ptr__->width = local_80.width;
    __return_storage_ptr__->height = local_80.height;
    __return_storage_ptr__->format = local_80.format;
    __return_storage_ptr__->valid = local_80.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_80._21_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_pkm_image(const void* src, rf_int src_size, rf_allocator allocator)
{
    rf_image result = {0};

    if (src && src_size > 0)
    {
        int dst_size = rf_get_pkm_image_size(src, src_size);
        void* dst = RF_ALLOC(allocator, dst_size);

        result = rf_load_pkm_image_to_buffer(src, src_size, dst, dst_size);
    }

    return result;
}